

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void __thiscall picojson::value::~value(value *this)

{
  int iVar1;
  string *psVar2;
  value *this_local;
  
  iVar1 = this->type_;
  if (iVar1 == 3) {
    psVar2 = (this->u_).string_;
    if (psVar2 != (string *)0x0) {
      std::__cxx11::string::~string((string *)psVar2);
      operator_delete(psVar2);
    }
  }
  else if (iVar1 == 4) {
    psVar2 = (this->u_).string_;
    if (psVar2 != (string *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)psVar2);
      operator_delete(psVar2);
    }
  }
  else if ((iVar1 == 5) && (psVar2 = (this->u_).string_, psVar2 != (string *)0x0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            *)psVar2);
    operator_delete(psVar2);
  }
  return;
}

Assistant:

inline value::~value() {
    switch (type_) {
#define DEINIT(p) case p##type: delete u_.p; break
      DEINIT(string_);
      DEINIT(array_);
      DEINIT(object_);
#undef DEINIT
    default: break;
    }
  }